

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

StackPage * __thiscall Lodtalk::StackMemory::allocatePage(StackMemory *this)

{
  StackPage *pSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  StackPage *local_20;
  
  ppSVar2 = (this->freePages).
            super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar3 = (this->freePages).
            super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 == ppSVar3) {
    pSVar1 = this->currentPage;
    do {
      local_20 = pSVar1;
      pSVar1 = local_20->previousPage;
    } while (local_20->previousPage != (StackPage *)0x0);
    StackPage::divorceAllFrames(local_20);
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
              (&this->freePages,&local_20);
    ppSVar2 = (this->freePages).
              super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar3 = (this->freePages).
              super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppSVar2 != ppSVar3) {
    pSVar1 = ppSVar3[-1];
    (this->freePages).
    super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar3 + -1;
    pSVar1->previousPage = (StackPage *)0x0;
    pSVar1->nextPage = (StackPage *)0x0;
    return pSVar1;
  }
  __assert_fail("!freePages.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0xca,"StackPage *Lodtalk::StackMemory::allocatePage()");
}

Assistant:

StackPage *StackMemory::allocatePage()
{
    StackPage *page = nullptr;
    if (freePages.empty())
    {
        // Find the least used page
        auto leastUsed = currentPage;
        for (; leastUsed->previousPage; leastUsed = leastUsed->previousPage)
            ;

        leastUsed->divorceAllFrames();
        freePages.push_back(leastUsed);
   }

    assert(!freePages.empty());
    page = freePages.back();
    freePages.pop_back();

    page->previousPage = nullptr;
    page->nextPage = nullptr;
    return page;
}